

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

void free_nonDevice_members_from_deviceOrModule(IOTHUB_DEVICE_OR_MODULE *deviceOrModule)

{
  IOTHUB_DEVICE_OR_MODULE *deviceOrModule_local;
  
  if (deviceOrModule != (IOTHUB_DEVICE_OR_MODULE *)0x0) {
    free(deviceOrModule->moduleId);
    deviceOrModule->moduleId = (char *)0x0;
    free(deviceOrModule->managedBy);
    deviceOrModule->managedBy = (char *)0x0;
  }
  return;
}

Assistant:

static void free_nonDevice_members_from_deviceOrModule(IOTHUB_DEVICE_OR_MODULE* deviceOrModule)
{
    if (deviceOrModule != NULL)
    {
        //free module exclusive fields
        free((void*)deviceOrModule->moduleId);
        deviceOrModule->moduleId = NULL;
        free((void*)deviceOrModule->managedBy);
        deviceOrModule->managedBy = NULL;
        //free device_ex exclusive fields (none currently require deallocation)
    }
}